

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

void amqp_ssl_socket_delete(void *base)

{
  uint __errnum;
  char *pcVar1;
  char *pcVar2;
  
  if (base != (void *)0x0) {
    amqp_ssl_socket_close(base,AMQP_SC_NONE);
    SSL_CTX_free(*(SSL_CTX **)((long)base + 8));
    free(base);
  }
  __errnum = pthread_mutex_lock((pthread_mutex_t *)&openssl_init_mutex);
  if (__errnum == 0) {
    if (0 < openssl_connections) {
      openssl_connections = openssl_connections + -1;
    }
    if (openssl_connections == 0) {
      amqp_openssl_bio_destroy();
      openssl_bio_initialized = 0;
    }
    __errnum = pthread_mutex_unlock((pthread_mutex_t *)&openssl_init_mutex);
    if (__errnum == 0) {
      return;
    }
    pcVar1 = strerror(__errnum);
    pcVar2 = "pthread_mutex_unlock(&openssl_init_mutex)";
  }
  else {
    pcVar1 = strerror(__errnum);
    pcVar2 = "pthread_mutex_lock(&openssl_init_mutex)";
  }
  amqp_abort("Check %s failed <%d>: %s",pcVar2,(ulong)__errnum,pcVar1);
}

Assistant:

static void amqp_ssl_socket_delete(void *base) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;

  if (self) {
    amqp_ssl_socket_close(self, AMQP_SC_NONE);

    SSL_CTX_free(self->ctx);
    free(self);
  }
  decrement_ssl_connections();
}